

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O3

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>::addFineLevels
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *this,
          int num_new_fine_levels)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pGVar3;
  pointer pGVar4;
  pointer pGVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 local_1b8 [64];
  pointer local_178;
  pointer pGStack_170;
  pointer local_168;
  pointer local_160;
  pointer local_158;
  pointer local_148;
  pointer local_140;
  pointer local_130;
  pointer local_128;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  local_118;
  Geometry r;
  
  if (0 < num_new_fine_levels) {
    if (0 < this->m_num_coarsen_opt) {
      this->m_num_coarsen_opt = this->m_num_coarsen_opt + num_new_fine_levels;
    }
    iVar6 = 1 << ((byte)num_new_fine_levels & 0x1f);
    local_118.
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar6,iVar6);
    local_118.
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_118.
                           super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar6);
    memcpy(&r,(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start,200);
    Geometry::refine(&r,(IntVect *)&local_118);
    IndexSpaceImp((IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *)local_1b8,
                  &this->m_gshop,&r,num_new_fine_levels + -1,num_new_fine_levels + -1,
                  *(this->m_ngrow).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,this->m_build_coarse_level_by_coarsening,this->m_extend_domain_face,
                  this->m_num_coarsen_opt);
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ::reserve((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               *)&local_178,
              (ulong)(uint)num_new_fine_levels +
              ((long)(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7);
    pBVar1 = (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar2 = (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pBVar1 != pBVar2 && -1 < (long)pBVar1 - (long)pBVar2) {
      lVar9 = 0;
      lVar8 = 0;
      do {
        std::
        vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
        ::emplace_back<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>
                  ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
                    *)&local_178,
                   (GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *)
                   ((long)&(((this->m_gslevel).
                             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                             .
                             super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_Level).m_geom + lVar9
                   ));
        lVar8 = lVar8 + 1;
        lVar7 = ((long)(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
        lVar9 = lVar9 + 0x1ad8;
      } while (lVar7 - lVar8 != 0 && lVar8 <= lVar7);
    }
    pGVar5 = local_168;
    pGVar4 = pGStack_170;
    pGVar3 = local_178;
    local_178 = (this->m_gslevel).
                super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                .
                super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pGStack_170 = (this->m_gslevel).
                  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                  .
                  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_168 = (this->m_gslevel).
                super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                .
                super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    r.super_CoordSys.c_sys = cartesian;
    r.super_CoordSys._4_4_ = 0;
    r.super_CoordSys.offset[0] = 0.0;
    r.super_CoordSys.offset[1] = 0.0;
    (this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ::~vector((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               *)&r);
    r.super_CoordSys.offset[1] =
         (Real)(this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pGVar5;
    r.super_CoordSys._0_8_ =
         (this->m_gslevel).
         super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
         .
         super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    r.super_CoordSys.offset[0] =
         (Real)(this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pGVar3;
    (this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar4;
    local_118.
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ::~vector((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               *)&r);
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
    ::~vector(&local_118);
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Geometry*,std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>>>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,
               (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start,local_160,local_158);
    std::vector<amrex::Box,std::allocator<amrex::Box>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,
               (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start,local_148,local_140);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,
               (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,local_130,local_128);
    ~IndexSpaceImp((IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *)local_1b8)
    ;
  }
  return;
}

Assistant:

void
IndexSpaceImp<G>::addFineLevels (int num_new_fine_levels)
{
    if (num_new_fine_levels <= 0) { return; }

    if (m_num_coarsen_opt > 0) {
        m_num_coarsen_opt += num_new_fine_levels;
    }

    IndexSpaceImp<G> fine_isp(m_gshop, amrex::refine(m_geom[0], 1<<num_new_fine_levels),
                              num_new_fine_levels-1, num_new_fine_levels-1,
                              m_ngrow[0], m_build_coarse_level_by_coarsening,
                              m_extend_domain_face, m_num_coarsen_opt);

    fine_isp.m_gslevel.reserve(m_domain.size()+num_new_fine_levels);
    for (int i = 0; i < m_domain.size(); ++i) {
        fine_isp.m_gslevel.emplace_back(std::move(m_gslevel[i]));
    }
    std::swap(fine_isp.m_gslevel, m_gslevel);

    m_geom.insert(m_geom.begin(), fine_isp.m_geom.begin(), fine_isp.m_geom.end());
    m_domain.insert(m_domain.begin(), fine_isp.m_domain.begin(), fine_isp.m_domain.end());
    m_ngrow.insert(m_ngrow.begin(), fine_isp.m_ngrow.begin(), fine_isp.m_ngrow.end());
}